

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

int point_mul_id_tc26_gost_3410_2012_256_paramSetA
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *output;
  char cVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uint64_t x2;
  BIGNUM *pBVar11;
  BIGNUM *pBVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uchar b_y [32];
  uchar b_x [32];
  uchar b_m [32];
  int8_t rnaf [52];
  pt_prj_t_conflict1 precomp [16];
  uint8_t local_cb8 [32];
  undefined1 local_c98 [24];
  long lStack_c80;
  ulong local_c78;
  uint64_t uStack_c70;
  uint64_t uStack_c68;
  uint64_t uStack_c60;
  uint64_t uStack_c58;
  uint64_t local_c50;
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  ulong local_c28;
  uint64_t uStack_c20;
  uint64_t uStack_c18;
  uint64_t uStack_c10;
  uint64_t uStack_c08;
  uint64_t local_c00;
  undefined1 local_bf8 [16];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  uint8_t local_bc8 [32];
  byte local_ba8 [32];
  undefined1 local_b88 [32];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined4 local_ab8;
  pt_aff_t_conflict1 local_ab0;
  pt_prj_t_conflict1 local_a38 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar11 = BN_CTX_get((BN_CTX *)ctx);
  pBVar12 = BN_CTX_get((BN_CTX *)ctx);
  iVar10 = 0;
  iVar17 = 0;
  if ((((pBVar12 != (BIGNUM *)0x0) &&
       (iVar9 = EC_POINT_get_affine_coordinates(group,q,pBVar11,pBVar12,ctx), iVar17 = iVar10,
       iVar9 != 0)) && (iVar10 = BN_bn2lebinpad(pBVar11,local_bc8,0x20), iVar10 == 0x20)) &&
     ((iVar10 = BN_bn2lebinpad(pBVar12,local_cb8,0x20), iVar10 == 0x20 &&
      (iVar10 = BN_bn2lebinpad(m,local_ba8,0x20), iVar10 == 0x20)))) {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_from_bytes(local_ab0.X,local_bc8);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_from_bytes(local_ab0.Y,local_cb8);
    local_ac8 = (undefined1  [16])0x0;
    local_ad8 = (undefined1  [16])0x0;
    local_ae8 = (undefined1  [16])0x0;
    local_ab8 = 0;
    lVar15 = 0;
    memset(local_b88,0,0xa0);
    memset(local_c98,0,0xa0);
    precomp_wnaf(local_a38,&local_ab0);
    scalar_rwnaf(local_ae8,local_ba8);
    iVar17 = (int)local_ab8._3_1_;
    lVar19 = 0;
    do {
      bVar21 = (int)(iVar17 + -1 >> 1 ^ (uint)lVar19) < 1;
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                ((uint64_t *)local_b88,bVar21,(uint64_t *)local_b88,
                 (uint64_t *)((long)local_a38[0].X + lVar15));
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                ((uint64_t *)(local_b68 + 8),bVar21,(uint64_t *)(local_b68 + 8),
                 (uint64_t *)((long)local_a38[0].Y + lVar15));
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                ((uint64_t *)local_b38,bVar21,(uint64_t *)local_b38,
                 (uint64_t *)((long)local_a38[0].T + lVar15));
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                ((uint64_t *)(local_b18 + 8),bVar21,(uint64_t *)(local_b18 + 8),
                 (uint64_t *)((long)local_a38[0].Z + lVar15));
      lVar19 = lVar19 + 1;
      lVar15 = lVar15 + 0xa0;
    } while (lVar19 != 0x10);
    lVar15 = 0x32;
    do {
      iVar17 = 5;
      do {
        point_double((pt_prj_t_conflict1 *)local_b88,(pt_prj_t_conflict1 *)local_b88);
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
      cVar1 = local_ae8[lVar15];
      cVar2 = cVar1 >> 7;
      lVar18 = 0;
      lVar19 = 0;
      do {
        bVar21 = (int)((int)(char)(-1 - cVar2) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                      (uint)lVar19) < 1;
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                  ((uint64_t *)local_c98,bVar21,(uint64_t *)local_c98,
                   (uint64_t *)((long)local_a38[0].X + lVar18));
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                  (&uStack_c70,bVar21,&uStack_c70,(uint64_t *)((long)local_a38[0].Y + lVar18));
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                  ((uint64_t *)local_c48,bVar21,(uint64_t *)local_c48,
                   (uint64_t *)((long)local_a38[0].T + lVar18));
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                  (&uStack_c20,bVar21,&uStack_c20,(uint64_t *)((long)local_a38[0].Z + lVar18));
        lVar19 = lVar19 + 1;
        lVar18 = lVar18 + 0xa0;
      } while (lVar19 != 0x10);
      uVar20 = 0xffffffffffffe - local_c78;
      uVar16 = 0xffffffffffffe - local_c28;
      uVar13 = (ulong)cVar2;
      uVar14 = ~uVar13;
      local_c78 = local_c78 & uVar14 | uVar13 & uVar20;
      auVar24._0_8_ = 0xffffffffffffe - local_c98._16_8_;
      auVar24._8_8_ = 0xffffffffffffe - local_c98._24_8_;
      local_bd8._0_8_ = 0x1ffffffffffb2e - local_c98._0_8_;
      local_bd8._8_8_ = 0xffffffffffffe - local_c98._8_8_;
      auVar22._0_4_ = (uint)cVar2;
      auVar22._4_4_ = 0;
      auVar22._8_4_ = auVar22._0_4_;
      auVar22._12_4_ = 0;
      auVar25._8_4_ = (int)uVar14;
      auVar25._0_8_ = uVar14;
      auVar25._12_4_ = (int)(uVar14 >> 0x20);
      local_c98._0_16_ = local_c98._0_16_ & auVar25 | auVar22 & local_bd8;
      register0x000012c0 = stack0xfffffffffffff378 & auVar25 | auVar22 & auVar24;
      local_c28 = uVar14 & local_c28 | uVar13 & uVar16;
      local_bf8._0_8_ = 0xffffffffffffe - local_c38._0_8_;
      local_bf8._8_8_ = 0xffffffffffffe - local_c38._8_8_;
      local_be8._0_8_ = 0x1ffffffffffb2e - local_c48._0_8_;
      local_be8._8_8_ = 0xffffffffffffe - local_c48._8_8_;
      local_c48 = local_c48 & auVar25 | auVar22 & local_be8;
      local_c38 = auVar25 & local_c38 | auVar22 & local_bf8;
      point_add_proj((pt_prj_t_conflict1 *)local_b88,(pt_prj_t_conflict1 *)local_b88,
                     (pt_prj_t_conflict1 *)local_c98);
      bVar21 = lVar15 != 0;
      lVar15 = lVar15 + -1;
    } while (bVar21);
    local_ab0.T[2] = local_bf8._0_8_;
    local_ab0.T[3] = local_bf8._8_8_;
    local_ab0.X[0] = local_bd8._0_8_;
    local_ab0.X[1] = local_bd8._8_8_;
    local_c78 = 0xffffffffffffe - local_a38[0].X[4];
    local_ab0.T[0] = local_be8._0_8_;
    local_ab0.T[1] = local_be8._8_8_;
    local_c98._8_8_ = 0xffffffffffffe - local_a38[0].X[1];
    local_c98._0_8_ = 0x1ffffffffffb2e - local_a38[0].X[0];
    lStack_c80 = 0xffffffffffffe - local_a38[0].X[3];
    local_c98._16_8_ = 0xffffffffffffe - local_a38[0].X[2];
    local_c50 = local_a38[0].Y[4];
    uStack_c60 = local_a38[0].Y[2];
    uStack_c58 = local_a38[0].Y[3];
    local_c28 = 0xffffffffffffe - local_a38[0].T[4];
    uStack_c70 = local_a38[0].Y[0];
    uStack_c68 = local_a38[0].Y[1];
    local_c48._8_8_ = 0xffffffffffffe - local_a38[0].T[1];
    local_c48._0_8_ = 0x1ffffffffffb2e - local_a38[0].T[0];
    local_c38._8_8_ = 0xffffffffffffe - local_a38[0].T[3];
    local_c38._0_8_ = 0xffffffffffffe - local_a38[0].T[2];
    local_c00 = local_a38[0].Z[4];
    uStack_c10 = local_a38[0].Z[2];
    uStack_c08 = local_a38[0].Z[3];
    uStack_c20 = local_a38[0].Z[0];
    uStack_c18 = local_a38[0].Z[1];
    local_ab0.X[2] = auVar24._0_8_;
    local_ab0.X[3] = auVar24._8_8_;
    local_ab0.X[4] = uVar20;
    local_ab0.T[4] = uVar16;
    point_add_proj((pt_prj_t_conflict1 *)local_c98,(pt_prj_t_conflict1 *)local_c98,
                   (pt_prj_t_conflict1 *)local_b88);
    lVar19 = -(ulong)(local_ba8[0] & 1);
    lVar15 = (ulong)(local_ba8[0] & 1) - 1;
    auVar23._8_4_ = (int)lVar19;
    auVar23._0_8_ = lVar19;
    auVar23._12_4_ = (int)((ulong)lVar19 >> 0x20);
    auVar26._8_4_ = (int)lVar15;
    auVar26._0_8_ = lVar15;
    auVar26._12_4_ = (int)((ulong)lVar15 >> 0x20);
    local_b88._0_16_ = local_c98._0_16_ & auVar26 | local_b88._0_16_ & auVar23;
    local_b88._16_16_ = stack0xfffffffffffff378 & auVar26 | local_b88._16_16_ & auVar23;
    auVar3._8_8_ = uStack_c70;
    auVar3._0_8_ = local_c78;
    local_b68 = auVar3 & auVar26 | local_b68 & auVar23;
    auVar4._8_8_ = uStack_c60;
    auVar4._0_8_ = uStack_c68;
    local_b58 = auVar4 & auVar26 | local_b58 & auVar23;
    auVar5._8_8_ = local_c50;
    auVar5._0_8_ = uStack_c58;
    local_b48 = auVar5 & auVar26 | local_b48 & auVar23;
    local_b38 = local_c48 & auVar26 | local_b38 & auVar23;
    local_b28 = local_c38 & auVar26 | local_b28 & auVar23;
    auVar6._8_8_ = uStack_c20;
    auVar6._0_8_ = local_c28;
    local_b18 = auVar6 & auVar26 | local_b18 & auVar23;
    auVar7._8_8_ = uStack_c10;
    auVar7._0_8_ = uStack_c18;
    local_b08 = auVar7 & auVar26 | local_b08 & auVar23;
    auVar8._8_8_ = local_c00;
    auVar8._0_8_ = uStack_c08;
    local_af8 = auVar26 & auVar8 | auVar23 & local_af8;
    point_double((pt_prj_t_conflict1 *)local_b88,(pt_prj_t_conflict1 *)local_b88);
    point_double((pt_prj_t_conflict1 *)local_b88,(pt_prj_t_conflict1 *)local_b88);
    point_edwards2legacy((pt_prj_t_conflict1 *)local_b88,(pt_prj_t_conflict1 *)local_b88);
    output = (uint64_t *)(local_b18 + 8);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(output,output);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_ab0.X,(uint64_t *)local_b88,output);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul
              (local_ab0.Y,(uint64_t *)(local_b68 + 8),output);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(local_bc8,local_ab0.X);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(local_cb8,local_ab0.Y);
    iVar17 = CRYPTO_memcmp("",local_bc8,0x20);
    if ((iVar17 == 0) && (iVar17 = CRYPTO_memcmp("",local_cb8,0x20), iVar17 == 0)) {
      iVar17 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar17 == 0) {
        iVar17 = 0;
        goto LAB_00134a31;
      }
    }
    else {
      lVar15 = BN_lebin2bn(local_bc8,0x20,pBVar11);
      iVar17 = 0;
      if ((lVar15 == 0) ||
         ((lVar15 = BN_lebin2bn(local_cb8,0x20,pBVar12), lVar15 == 0 ||
          (iVar10 = EC_POINT_set_affine_coordinates(group,r,pBVar11,pBVar12,ctx), iVar10 == 0))))
      goto LAB_00134a31;
    }
    iVar17 = 1;
  }
LAB_00134a31:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar17;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_256_paramSetA(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}